

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O2

string * __thiscall
cmsys::SystemInformationImplementation::ParseValueFromKStat_abi_cxx11_
          (string *__return_storage_ptr__,SystemInformationImplementation *this,char *arguments)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  SystemInformationImplementation *this_00;
  char cVar4;
  long lVar5;
  long lVar6;
  vector<const_char_*,_std::allocator<const_char_*>_> args;
  string buffer;
  string lastArg;
  string command;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> local_68;
  string val;
  
  args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  command._M_dataplus._M_p = "kstat";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&args,(char **)&command);
  command._M_dataplus._M_p = "-p";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&args,(char **)&command);
  std::__cxx11::string::string((string *)&command,arguments,(allocator *)&lastArg);
LAB_0044c410:
  cVar4 = (char)&command;
  uVar1 = std::__cxx11::string::find(cVar4,0x20);
  if (uVar1 != 0xffffffffffffffff) {
    while( true ) {
      uVar2 = std::__cxx11::string::find(cVar4,0x22);
      uVar3 = std::__cxx11::string::find(cVar4,0x22);
      if ((uVar3 <= uVar2) || (uVar3 == 0xffffffffffffffff)) break;
      if (uVar2 < uVar1 && uVar1 < uVar3) goto LAB_0044c410;
    }
    std::__cxx11::string::substr((ulong)&lastArg,(ulong)&command);
    while (uVar1 = std::__cxx11::string::find((char)&lastArg,0x22), uVar1 != 0xffffffffffffffff) {
      std::__cxx11::string::erase((ulong)&lastArg,uVar1);
    }
    buffer._M_dataplus = lastArg._M_dataplus;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&args,(char **)&buffer);
    std::__cxx11::string::~string((string *)&lastArg);
    goto LAB_0044c410;
  }
  std::__cxx11::string::substr((ulong)&lastArg,(ulong)&command);
  buffer._M_dataplus = lastArg._M_dataplus;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&args,(char **)&buffer);
  buffer._M_dataplus._M_p = (pointer)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&args,(char **)&buffer);
  this_00 = (SystemInformationImplementation *)&args;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&local_68,
             (vector<const_char_*,_std::allocator<const_char_*>_> *)this_00);
  RunProcess_abi_cxx11_
            (&buffer,this_00,(vector<const_char_*,_std::allocator<const_char_*>_> *)&local_68);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base(&local_68);
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&val);
  lVar6 = buffer._M_string_length - 1;
  while (lVar5 = lVar6, lVar6 = lVar5 + -1, lVar5 != 0) {
    cVar4 = buffer._M_dataplus._M_p[lVar5];
    if ((cVar4 != '\n') && (cVar4 != '\r')) {
      if ((cVar4 == '\t') || (cVar4 == ' ')) break;
      std::__cxx11::string::string((string *)&val,(string *)__return_storage_ptr__);
      std::__cxx11::string::operator=
                ((string *)__return_storage_ptr__,buffer._M_dataplus._M_p[lVar5]);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&val);
    }
  }
  std::__cxx11::string::~string((string *)&buffer);
  std::__cxx11::string::~string((string *)&lastArg);
  std::__cxx11::string::~string((string *)&command);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemInformationImplementation::ParseValueFromKStat(
  const char* arguments)
{
  std::vector<const char*> args;
  args.clear();
  args.push_back("kstat");
  args.push_back("-p");

  std::string command = arguments;
  size_t start = std::string::npos;
  size_t pos = command.find(' ', 0);
  while (pos != std::string::npos) {
    bool inQuotes = false;
    // Check if we are between quotes
    size_t b0 = command.find('"', 0);
    size_t b1 = command.find('"', b0 + 1);
    while (b0 != std::string::npos && b1 != std::string::npos && b1 > b0) {
      if (pos > b0 && pos < b1) {
        inQuotes = true;
        break;
      }
      b0 = command.find('"', b1 + 1);
      b1 = command.find('"', b0 + 1);
    }

    if (!inQuotes) {
      std::string arg = command.substr(start + 1, pos - start - 1);

      // Remove the quotes if any
      size_t quotes = arg.find('"');
      while (quotes != std::string::npos) {
        arg.erase(quotes, 1);
        quotes = arg.find('"');
      }
      args.push_back(arg.c_str());
      start = pos;
    }
    pos = command.find(' ', pos + 1);
  }
  std::string lastArg = command.substr(start + 1, command.size() - start - 1);
  args.push_back(lastArg.c_str());

  args.push_back(0);

  std::string buffer = this->RunProcess(args);

  std::string value = "";
  for (size_t i = buffer.size() - 1; i > 0; i--) {
    if (buffer[i] == ' ' || buffer[i] == '\t') {
      break;
    }
    if (buffer[i] != '\n' && buffer[i] != '\r') {
      std::string val = value;
      value = buffer[i];
      value += val;
    }
  }
  return value;
}